

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_cont_helpers.hpp
# Opt level: O0

bool asio_handler_cont_helpers::
     is_continuation<tonk::Connection::OnP2PConnection(unsigned_long,asio::ip::basic_endpoint<asio::ip::udp>const&,tonk::DatagramBuffer,unsigned_long,tonk::ConnectionAddrMap*,tonk::IUDPSender*)::__0>
               (type *context)

{
  bool bVar1;
  undefined8 in_RDI;
  
  bVar1 = asio::asio_handler_is_continuation(in_RDI);
  return bVar1;
}

Assistant:

inline bool is_continuation(Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  return false;
#else
  using asio::asio_handler_is_continuation;
  return asio_handler_is_continuation(
      asio::detail::addressof(context));
#endif
}